

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.cpp
# Opt level: O3

Statistics * __thiscall
embree::BVHNStatistics<4>::statistics
          (Statistics *__return_storage_ptr__,BVHNStatistics<4> *this,NodeRef node,double A,
          BBox1f t0t1)

{
  size_t *psVar1;
  long *plVar2;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes_00;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes_01;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes_02;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes_03;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes_04;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes_05;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes_00;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes_01;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes_02;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes_03;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes_04;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes_05;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB_00;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB_01;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB_02;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB_03;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB_04;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB_05;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D_00;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D_01;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D_02;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D_03;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D_04;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D_05;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB_00;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB_01;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB_02;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB_03;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB_04;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB_05;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes_00;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes_01;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes_02;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes_03;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes_04;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes_05;
  char cVar3;
  long lVar4;
  runtime_error *prVar5;
  long lVar6;
  size_t sVar7;
  LeafStat *pLVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  AABBNode *n;
  task_group_context context;
  Statistics v;
  lambda_reduce_body<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_______common_algorithms_parallel_reduce_h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>
  body;
  LeafStat in_stack_fffffffffffff248;
  undefined1 local_ca8 [16];
  undefined1 local_c98 [24];
  anon_class_16_2_ed117de8_conflict13 local_c80;
  blocked_range<int> local_c70;
  size_t local_c60;
  anon_class_24_3_c8748052 local_c58;
  anon_class_24_3_8ee612a4_conflict2 local_c40;
  task_group_context local_c28;
  size_t local_ba8;
  size_t sStack_ba0;
  size_t local_b98;
  undefined8 local_b88;
  undefined8 uStack_b80;
  size_t local_b78;
  undefined8 local_b68;
  undefined8 uStack_b60;
  size_t local_b58;
  undefined8 local_b48;
  undefined8 uStack_b40;
  size_t local_b38;
  undefined8 local_b28;
  undefined8 uStack_b20;
  size_t local_b18;
  undefined8 local_b08;
  undefined8 uStack_b00;
  size_t local_af8;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  size_t local_ad8;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  size_t local_ab8;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  size_t local_a98;
  undefined8 local_a88;
  undefined8 uStack_a80;
  size_t local_a78;
  undefined8 local_a68;
  undefined8 uStack_a60;
  size_t local_a58;
  undefined8 local_a48;
  undefined8 uStack_a40;
  size_t local_a38;
  undefined8 local_a28;
  undefined8 uStack_a20;
  size_t local_a18;
  undefined8 local_a08;
  undefined8 uStack_a00;
  size_t local_9f8;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  size_t local_9d8;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  size_t local_9b8;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  size_t local_998;
  undefined8 local_988;
  undefined8 uStack_980;
  size_t local_978;
  undefined8 local_968;
  undefined8 uStack_960;
  size_t local_958;
  undefined8 local_948;
  undefined8 uStack_940;
  size_t local_938;
  undefined8 local_928;
  undefined8 uStack_920;
  size_t local_918;
  undefined8 local_908;
  undefined8 uStack_900;
  size_t local_8f8;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  size_t local_8d8;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  size_t local_8b8;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  size_t local_898;
  undefined8 local_888;
  undefined8 uStack_880;
  size_t local_878;
  undefined8 local_868;
  undefined8 uStack_860;
  size_t local_858;
  undefined8 local_848;
  undefined8 uStack_840;
  size_t local_838;
  undefined8 local_828;
  undefined8 uStack_820;
  size_t local_818;
  undefined8 local_808;
  undefined8 uStack_800;
  size_t local_7f8;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  size_t local_7d8;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  size_t local_7b8;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  size_t local_798;
  undefined8 local_788;
  undefined8 uStack_780;
  size_t local_778;
  undefined8 local_768;
  undefined8 uStack_760;
  size_t local_758;
  undefined8 local_748;
  undefined8 uStack_740;
  size_t local_738;
  undefined8 local_728;
  undefined8 uStack_720;
  size_t local_718;
  undefined8 local_708;
  undefined8 uStack_700;
  size_t local_6f8;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  size_t local_6d8;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  size_t local_6b8;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  size_t local_698;
  undefined8 local_688;
  undefined8 uStack_680;
  size_t local_678;
  Statistics local_670;
  lambda_reduce_body<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_______common_algorithms_parallel_reduce_h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>
  local_568;
  Statistics local_448;
  LeafStat local_340;
  LeafStat local_2d0;
  LeafStat local_260;
  LeafStat local_1f0;
  LeafStat local_180;
  LeafStat local_110;
  LeafStat local_a0;
  
  bVar12 = 0;
  local_c98._8_4_ = in_XMM1_Dc;
  local_c98._0_8_ = t0t1;
  local_c98._12_4_ = in_XMM1_Dd;
  local_ca8._0_8_ = t0t1;
  Statistics::LeafStat::LeafStat(&local_a0,0.0,0,0,0,0,0);
  local_678 = 0;
  local_688 = 0;
  uStack_680 = 0;
  local_6a8 = 0;
  uStack_6a0 = 0;
  local_698 = 0;
  local_6c8 = 0;
  uStack_6c0 = 0;
  local_6b8 = 0;
  local_6e8 = 0;
  uStack_6e0 = 0;
  local_6d8 = 0;
  local_708 = 0;
  uStack_700 = 0;
  local_6f8 = 0;
  local_728 = 0;
  uStack_720 = 0;
  local_718 = 0;
  pLVar8 = &local_a0;
  pdVar9 = (double *)&stack0xfffffffffffff248;
  for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pdVar9 = pLVar8->leafSAH;
    pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar12 * -0x10 + 8);
    pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
  }
  statAABBNodes.numNodes = uStack_680;
  statAABBNodes.nodeSAH = (double)local_688;
  statAABBNodes.numChildren = local_678;
  statOBBNodes.numNodes = uStack_6a0;
  statOBBNodes.nodeSAH = (double)local_6a8;
  statOBBNodes.numChildren = local_698;
  statAABBNodesMB.numNodes = uStack_6c0;
  statAABBNodesMB.nodeSAH = (double)local_6c8;
  statAABBNodesMB.numChildren = local_6b8;
  statAABBNodesMB4D.numNodes = uStack_6e0;
  statAABBNodesMB4D.nodeSAH = (double)local_6e8;
  statAABBNodesMB4D.numChildren = local_6d8;
  statOBBNodesMB.numNodes = uStack_700;
  statOBBNodesMB.nodeSAH = (double)local_708;
  statOBBNodesMB.numChildren = local_6f8;
  statQuantizedNodes.numNodes = uStack_720;
  statQuantizedNodes.nodeSAH = (double)local_728;
  statQuantizedNodes.numChildren = local_718;
  Statistics::Statistics
            (__return_storage_ptr__,0,in_stack_fffffffffffff248,statAABBNodes,statOBBNodes,
             statAABBNodesMB,statAABBNodesMB4D,statOBBNodesMB,statQuantizedNodes);
  fVar13 = (float)local_c98._4_4_ - (float)local_c98._0_4_;
  if (fVar13 <= 0.0) {
    fVar13 = 0.0;
  }
  uVar10 = (ulong)((uint)node.ptr & 0xf);
  local_c98._0_8_ = (double)fVar13;
  local_c58.this = this;
  local_c58.t0t1 = (BBox1f *)this;
  switch(uVar10) {
  case 0:
    local_ca8._8_8_ = node.ptr;
    Statistics::LeafStat::LeafStat(&local_110,0.0,0,0,0,0,0);
    local_738 = 0;
    local_748 = 0;
    uStack_740 = 0;
    local_768 = 0;
    uStack_760 = 0;
    local_758 = 0;
    local_788 = 0;
    uStack_780 = 0;
    local_778 = 0;
    local_7a8 = 0;
    uStack_7a0 = 0;
    local_798 = 0;
    local_7c8 = 0;
    uStack_7c0 = 0;
    local_7b8 = 0;
    local_7e8 = 0;
    uStack_7e0 = 0;
    local_7d8 = 0;
    pLVar8 = &local_110;
    pdVar9 = (double *)&stack0xfffffffffffff248;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pdVar9 = pLVar8->leafSAH;
      pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar12 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
    }
    statAABBNodes_00.numNodes = uStack_740;
    statAABBNodes_00.nodeSAH = (double)local_748;
    statAABBNodes_00.numChildren = local_738;
    statOBBNodes_00.numNodes = uStack_760;
    statOBBNodes_00.nodeSAH = (double)local_768;
    statOBBNodes_00.numChildren = local_758;
    statAABBNodesMB_00.numNodes = uStack_780;
    statAABBNodesMB_00.nodeSAH = (double)local_788;
    statAABBNodesMB_00.numChildren = local_778;
    statAABBNodesMB4D_00.numNodes = uStack_7a0;
    statAABBNodesMB4D_00.nodeSAH = (double)local_7a8;
    statAABBNodesMB4D_00.numChildren = local_798;
    statOBBNodesMB_00.numNodes = uStack_7c0;
    statOBBNodesMB_00.nodeSAH = (double)local_7c8;
    statOBBNodesMB_00.numChildren = local_7b8;
    statQuantizedNodes_00.numNodes = uStack_7e0;
    statQuantizedNodes_00.nodeSAH = (double)local_7e8;
    statQuantizedNodes_00.numChildren = local_7d8;
    Statistics::Statistics
              (&local_448,0,in_stack_fffffffffffff248,statAABBNodes_00,statOBBNodes_00,
               statAABBNodesMB_00,statAABBNodesMB4D_00,statOBBNodesMB_00,statQuantizedNodes_00);
    local_c40.func = &local_c58;
    local_c58.t0t1 = (BBox1f *)local_ca8;
    local_c40.reduction = Statistics::add;
    local_c28.my_version = proxy_support;
    local_c28.my_traits = (context_traits)0x4;
    local_c28.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_c28.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_c28.my_name = CUSTOM_CTX;
    local_c58.n = (AABBNode **)(local_ca8 + 8);
    local_c40.identity = &local_448;
    tbb::detail::r1::initialize(&local_c28);
    local_c70.my_end = 4;
    local_c70.my_begin = 0;
    local_c70.my_grainsize = 1;
    local_568.my_real_body = &local_c80;
    local_c80.reduction = Statistics::add;
    local_568.my_reduction = Statistics::add;
    local_c80.func = &local_c40;
    local_568.my_identity_element = &local_448;
    memcpy(&local_568.my_value,&local_448,0x108);
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_reduce.h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run(&local_c70,&local_568,(auto_partitioner *)&local_670,&local_c28);
    memcpy(&local_670,&local_568.my_value,0x108);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_c28);
    if (cVar3 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_c28);
    operator+((Statistics *)&local_568,__return_storage_ptr__,&local_670);
    memcpy(__return_storage_ptr__,&local_568,0x108);
    psVar1 = &(__return_storage_ptr__->statAABBNodes).numNodes;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->statAABBNodes).nodeSAH =
         (double)local_c98._0_8_ * A + (__return_storage_ptr__->statAABBNodes).nodeSAH;
    break;
  case 1:
    local_ca8._8_8_ = node.ptr & 0xfffffffffffffff0;
    Statistics::LeafStat::LeafStat(&local_1f0,0.0,0,0,0,0,0);
    local_8b8 = 0;
    local_8c8 = 0;
    uStack_8c0 = 0;
    local_8e8 = 0;
    uStack_8e0 = 0;
    local_8d8 = 0;
    local_908 = 0;
    uStack_900 = 0;
    local_8f8 = 0;
    local_928 = 0;
    uStack_920 = 0;
    local_918 = 0;
    local_948 = 0;
    uStack_940 = 0;
    local_938 = 0;
    local_968 = 0;
    uStack_960 = 0;
    local_958 = 0;
    pLVar8 = &local_1f0;
    pdVar9 = (double *)&stack0xfffffffffffff248;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pdVar9 = pLVar8->leafSAH;
      pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar12 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
    }
    statAABBNodes_03.numNodes = uStack_8c0;
    statAABBNodes_03.nodeSAH = (double)local_8c8;
    statAABBNodes_03.numChildren = local_8b8;
    statOBBNodes_03.numNodes = uStack_8e0;
    statOBBNodes_03.nodeSAH = (double)local_8e8;
    statOBBNodes_03.numChildren = local_8d8;
    statAABBNodesMB_03.numNodes = uStack_900;
    statAABBNodesMB_03.nodeSAH = (double)local_908;
    statAABBNodesMB_03.numChildren = local_8f8;
    statAABBNodesMB4D_03.numNodes = uStack_920;
    statAABBNodesMB4D_03.nodeSAH = (double)local_928;
    statAABBNodesMB4D_03.numChildren = local_918;
    statOBBNodesMB_03.numNodes = uStack_940;
    statOBBNodesMB_03.nodeSAH = (double)local_948;
    statOBBNodesMB_03.numChildren = local_938;
    statQuantizedNodes_03.numNodes = uStack_960;
    statQuantizedNodes_03.nodeSAH = (double)local_968;
    statQuantizedNodes_03.numChildren = local_958;
    Statistics::Statistics
              (&local_448,0,in_stack_fffffffffffff248,statAABBNodes_03,statOBBNodes_03,
               statAABBNodesMB_03,statAABBNodesMB4D_03,statOBBNodesMB_03,statQuantizedNodes_03);
    local_c40.func = &local_c58;
    local_c58.this = (BVHNStatistics<4> *)local_ca8;
    local_c40.reduction = Statistics::add;
    local_c28.my_version = proxy_support;
    local_c28.my_traits = (context_traits)0x4;
    local_c28.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_c28.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_c28.my_name = CUSTOM_CTX;
    local_c58.n = (AABBNode **)(local_ca8 + 8);
    local_c40.identity = &local_448;
    tbb::detail::r1::initialize(&local_c28);
    local_c70.my_end = 4;
    local_c70.my_begin = 0;
    local_c70.my_grainsize = 1;
    local_568.my_real_body = &local_c80;
    local_c80.reduction = Statistics::add;
    local_568.my_reduction = Statistics::add;
    local_c80.func = &local_c40;
    local_568.my_identity_element = &local_448;
    memcpy(&local_568.my_value,&local_448,0x108);
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_reduce.h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run(&local_c70,&local_568,(auto_partitioner *)&local_670,&local_c28);
    memcpy(&local_670,&local_568.my_value,0x108);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_c28);
    if (cVar3 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_c28);
    operator+((Statistics *)&local_568,__return_storage_ptr__,&local_670);
    memcpy(__return_storage_ptr__,&local_568,0x108);
    psVar1 = &(__return_storage_ptr__->statAABBNodesMB).numNodes;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->statAABBNodesMB).nodeSAH =
         (double)local_c98._0_8_ * A + (__return_storage_ptr__->statAABBNodesMB).nodeSAH;
    break;
  case 2:
    local_ca8._8_8_ = node.ptr & 0xfffffffffffffff0;
    Statistics::LeafStat::LeafStat(&local_180,0.0,0,0,0,0,0);
    local_7f8 = 0;
    local_808 = 0;
    uStack_800 = 0;
    local_828 = 0;
    uStack_820 = 0;
    local_818 = 0;
    local_848 = 0;
    uStack_840 = 0;
    local_838 = 0;
    local_868 = 0;
    uStack_860 = 0;
    local_858 = 0;
    local_888 = 0;
    uStack_880 = 0;
    local_878 = 0;
    local_8a8 = 0;
    uStack_8a0 = 0;
    local_898 = 0;
    pLVar8 = &local_180;
    pdVar9 = (double *)&stack0xfffffffffffff248;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pdVar9 = pLVar8->leafSAH;
      pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar12 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
    }
    statAABBNodes_01.numNodes = uStack_800;
    statAABBNodes_01.nodeSAH = (double)local_808;
    statAABBNodes_01.numChildren = local_7f8;
    statOBBNodes_01.numNodes = uStack_820;
    statOBBNodes_01.nodeSAH = (double)local_828;
    statOBBNodes_01.numChildren = local_818;
    statAABBNodesMB_01.numNodes = uStack_840;
    statAABBNodesMB_01.nodeSAH = (double)local_848;
    statAABBNodesMB_01.numChildren = local_838;
    statAABBNodesMB4D_01.numNodes = uStack_860;
    statAABBNodesMB4D_01.nodeSAH = (double)local_868;
    statAABBNodesMB4D_01.numChildren = local_858;
    statOBBNodesMB_01.numNodes = uStack_880;
    statOBBNodesMB_01.nodeSAH = (double)local_888;
    statOBBNodesMB_01.numChildren = local_878;
    statQuantizedNodes_01.numNodes = uStack_8a0;
    statQuantizedNodes_01.nodeSAH = (double)local_8a8;
    statQuantizedNodes_01.numChildren = local_898;
    Statistics::Statistics
              (&local_448,0,in_stack_fffffffffffff248,statAABBNodes_01,statOBBNodes_01,
               statAABBNodesMB_01,statAABBNodesMB4D_01,statOBBNodesMB_01,statQuantizedNodes_01);
    local_c40.func = &local_c58;
    local_c58.t0t1 = (BBox1f *)local_ca8;
    local_c40.reduction = Statistics::add;
    local_c28.my_version = proxy_support;
    local_c28.my_traits = (context_traits)0x4;
    local_c28.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_c28.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_c28.my_name = CUSTOM_CTX;
    local_c58.n = (AABBNode **)(local_ca8 + 8);
    local_c40.identity = &local_448;
    tbb::detail::r1::initialize(&local_c28);
    local_c70.my_end = 4;
    local_c70.my_begin = 0;
    local_c70.my_grainsize = 1;
    local_568.my_real_body = &local_c80;
    local_c80.reduction = Statistics::add;
    local_568.my_reduction = Statistics::add;
    local_c80.func = &local_c40;
    local_568.my_identity_element = &local_448;
    memcpy(&local_568.my_value,&local_448,0x108);
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_reduce.h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run(&local_c70,&local_568,(auto_partitioner *)&local_670,&local_c28);
    memcpy(&local_670,&local_568.my_value,0x108);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_c28);
    if (cVar3 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_c28);
    operator+((Statistics *)&local_568,__return_storage_ptr__,&local_670);
    memcpy(__return_storage_ptr__,&local_568,0x108);
    psVar1 = &(__return_storage_ptr__->statOBBNodes).numNodes;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->statOBBNodes).nodeSAH =
         (double)local_c98._0_8_ * A + (__return_storage_ptr__->statOBBNodes).nodeSAH;
    break;
  case 3:
    local_ca8._8_8_ = node.ptr & 0xfffffffffffffff0;
    Statistics::LeafStat::LeafStat(&local_2d0,0.0,0,0,0,0,0);
    local_a38 = 0;
    local_a48 = 0;
    uStack_a40 = 0;
    local_a68 = 0;
    uStack_a60 = 0;
    local_a58 = 0;
    local_a88 = 0;
    uStack_a80 = 0;
    local_a78 = 0;
    local_aa8 = 0;
    uStack_aa0 = 0;
    local_a98 = 0;
    local_ac8 = 0;
    uStack_ac0 = 0;
    local_ab8 = 0;
    local_ae8 = 0;
    uStack_ae0 = 0;
    local_ad8 = 0;
    pLVar8 = &local_2d0;
    pdVar9 = (double *)&stack0xfffffffffffff248;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pdVar9 = pLVar8->leafSAH;
      pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar12 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
    }
    statAABBNodes_04.numNodes = uStack_a40;
    statAABBNodes_04.nodeSAH = (double)local_a48;
    statAABBNodes_04.numChildren = local_a38;
    statOBBNodes_04.numNodes = uStack_a60;
    statOBBNodes_04.nodeSAH = (double)local_a68;
    statOBBNodes_04.numChildren = local_a58;
    statAABBNodesMB_04.numNodes = uStack_a80;
    statAABBNodesMB_04.nodeSAH = (double)local_a88;
    statAABBNodesMB_04.numChildren = local_a78;
    statAABBNodesMB4D_04.numNodes = uStack_aa0;
    statAABBNodesMB4D_04.nodeSAH = (double)local_aa8;
    statAABBNodesMB4D_04.numChildren = local_a98;
    statOBBNodesMB_04.numNodes = uStack_ac0;
    statOBBNodesMB_04.nodeSAH = (double)local_ac8;
    statOBBNodesMB_04.numChildren = local_ab8;
    statQuantizedNodes_04.numNodes = uStack_ae0;
    statQuantizedNodes_04.nodeSAH = (double)local_ae8;
    statQuantizedNodes_04.numChildren = local_ad8;
    Statistics::Statistics
              (&local_448,0,in_stack_fffffffffffff248,statAABBNodes_04,statOBBNodes_04,
               statAABBNodesMB_04,statAABBNodesMB4D_04,statOBBNodesMB_04,statQuantizedNodes_04);
    local_c40.func = &local_c58;
    local_c58.t0t1 = (BBox1f *)local_ca8;
    local_c40.reduction = Statistics::add;
    local_c28.my_version = proxy_support;
    local_c28.my_traits = (context_traits)0x4;
    local_c28.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_c28.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_c28.my_name = CUSTOM_CTX;
    local_c58.n = (AABBNode **)(local_ca8 + 8);
    local_c40.identity = &local_448;
    tbb::detail::r1::initialize(&local_c28);
    local_c70.my_end = 4;
    local_c70.my_begin = 0;
    local_c70.my_grainsize = 1;
    local_568.my_real_body = &local_c80;
    local_c80.reduction = Statistics::add;
    local_568.my_reduction = Statistics::add;
    local_c80.func = &local_c40;
    local_568.my_identity_element = &local_448;
    memcpy(&local_568.my_value,&local_448,0x108);
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_reduce.h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run(&local_c70,&local_568,(auto_partitioner *)&local_670,&local_c28);
    memcpy(&local_670,&local_568.my_value,0x108);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_c28);
    if (cVar3 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_c28);
    operator+((Statistics *)&local_568,__return_storage_ptr__,&local_670);
    memcpy(__return_storage_ptr__,&local_568,0x108);
    psVar1 = &(__return_storage_ptr__->statOBBNodesMB).numNodes;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->statOBBNodesMB).nodeSAH =
         (double)local_c98._0_8_ * A + (__return_storage_ptr__->statOBBNodesMB).nodeSAH;
    break;
  default:
    if ((node.ptr & 8) == 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"not supported node type in bvh_statistics");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar7 = uVar10 - 8;
    if (sVar7 == 0) {
      return __return_storage_ptr__;
    }
    uVar11 = node.ptr & 0xfffffffffffffff0;
    local_c60 = sVar7;
    do {
      plVar2 = *(long **)&(this->bvh->super_AccelData).field_0x58;
      lVar6 = (**(code **)(*plVar2 + 0x18))(plVar2,uVar11);
      plVar2 = *(long **)&(this->bvh->super_AccelData).field_0x58;
      lVar4 = (**(code **)(*plVar2 + 8))(plVar2,uVar11);
      psVar1 = &(__return_storage_ptr__->statLeaf).numPrimsActive;
      *psVar1 = *psVar1 + lVar4;
      plVar2 = *(long **)&(this->bvh->super_AccelData).field_0x58;
      lVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,uVar11);
      psVar1 = &(__return_storage_ptr__->statLeaf).numPrimsTotal;
      *psVar1 = *psVar1 + lVar4;
      psVar1 = &(__return_storage_ptr__->statLeaf).numBytes;
      *psVar1 = *psVar1 + lVar6;
      uVar11 = uVar11 + lVar6;
      sVar7 = sVar7 - 1;
    } while (sVar7 != 0);
    psVar1 = &(__return_storage_ptr__->statLeaf).numLeaves;
    *psVar1 = *psVar1 + 1;
    psVar1 = &(__return_storage_ptr__->statLeaf).numPrimBlocks;
    *psVar1 = *psVar1 + local_c60;
    auVar14._8_4_ = (int)(local_c60 >> 0x20);
    auVar14._0_8_ = local_c60;
    auVar14._12_4_ = 0x45300000;
    (__return_storage_ptr__->statLeaf).leafSAH =
         ((auVar14._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_c60) - 4503599627370496.0)) *
         (double)local_c98._0_8_ * A + (__return_storage_ptr__->statLeaf).leafSAH;
    if (7 < uVar10 - 9) {
      return __return_storage_ptr__;
    }
    psVar1 = (__return_storage_ptr__->statLeaf).numPrimBlocksHistogram + (uVar10 - 9);
    *psVar1 = *psVar1 + 1;
    return __return_storage_ptr__;
  case 5:
    local_ca8._8_8_ = node.ptr & 0xfffffffffffffff0;
    Statistics::LeafStat::LeafStat(&local_340,0.0,0,0,0,0,0);
    local_af8 = 0;
    local_b08 = 0;
    uStack_b00 = 0;
    local_b28 = 0;
    uStack_b20 = 0;
    local_b18 = 0;
    local_b48 = 0;
    uStack_b40 = 0;
    local_b38 = 0;
    local_b68 = 0;
    uStack_b60 = 0;
    local_b58 = 0;
    local_b88 = 0;
    uStack_b80 = 0;
    local_b78 = 0;
    local_ba8 = 0;
    sStack_ba0 = 0;
    local_b98 = 0;
    pLVar8 = &local_340;
    pdVar9 = (double *)&stack0xfffffffffffff248;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pdVar9 = pLVar8->leafSAH;
      pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar12 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
    }
    statAABBNodes_05.numNodes = uStack_b00;
    statAABBNodes_05.nodeSAH = (double)local_b08;
    statAABBNodes_05.numChildren = local_af8;
    statOBBNodes_05.numNodes = uStack_b20;
    statOBBNodes_05.nodeSAH = (double)local_b28;
    statOBBNodes_05.numChildren = local_b18;
    statAABBNodesMB_05.numNodes = uStack_b40;
    statAABBNodesMB_05.nodeSAH = (double)local_b48;
    statAABBNodesMB_05.numChildren = local_b38;
    statAABBNodesMB4D_05.numNodes = uStack_b60;
    statAABBNodesMB4D_05.nodeSAH = (double)local_b68;
    statAABBNodesMB4D_05.numChildren = local_b58;
    statOBBNodesMB_05.numNodes = uStack_b80;
    statOBBNodesMB_05.nodeSAH = (double)local_b88;
    statOBBNodesMB_05.numChildren = local_b78;
    statQuantizedNodes_05.numNodes = sStack_ba0;
    statQuantizedNodes_05.nodeSAH = (double)local_ba8;
    statQuantizedNodes_05.numChildren = local_b98;
    Statistics::Statistics
              (&local_448,0,in_stack_fffffffffffff248,statAABBNodes_05,statOBBNodes_05,
               statAABBNodesMB_05,statAABBNodesMB4D_05,statOBBNodesMB_05,statQuantizedNodes_05);
    local_c40.func = &local_c58;
    local_c58.t0t1 = (BBox1f *)local_ca8;
    local_c40.reduction = Statistics::add;
    local_c28.my_version = proxy_support;
    local_c28.my_traits = (context_traits)0x4;
    local_c28.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_c28.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_c28.my_name = CUSTOM_CTX;
    local_c58.n = (AABBNode **)(local_ca8 + 8);
    local_c40.identity = &local_448;
    tbb::detail::r1::initialize(&local_c28);
    local_c70.my_end = 4;
    local_c70.my_begin = 0;
    local_c70.my_grainsize = 1;
    local_568.my_real_body = &local_c80;
    local_c80.reduction = Statistics::add;
    local_568.my_reduction = Statistics::add;
    local_c80.func = &local_c40;
    local_568.my_identity_element = &local_448;
    memcpy(&local_568.my_value,&local_448,0x108);
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_reduce.h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run(&local_c70,&local_568,(auto_partitioner *)&local_670,&local_c28);
    memcpy(&local_670,&local_568.my_value,0x108);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_c28);
    if (cVar3 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_c28);
    operator+((Statistics *)&local_568,__return_storage_ptr__,&local_670);
    memcpy(__return_storage_ptr__,&local_568,0x108);
    psVar1 = &(__return_storage_ptr__->statQuantizedNodes).numNodes;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->statQuantizedNodes).nodeSAH =
         (double)local_c98._0_8_ * A + (__return_storage_ptr__->statQuantizedNodes).nodeSAH;
    break;
  case 6:
    local_ca8._8_8_ = node.ptr & 0xfffffffffffffff0;
    Statistics::LeafStat::LeafStat(&local_260,0.0,0,0,0,0,0);
    local_978 = 0;
    local_988 = 0;
    uStack_980 = 0;
    local_9a8 = 0;
    uStack_9a0 = 0;
    local_998 = 0;
    local_9c8 = 0;
    uStack_9c0 = 0;
    local_9b8 = 0;
    local_9e8 = 0;
    uStack_9e0 = 0;
    local_9d8 = 0;
    local_a08 = 0;
    uStack_a00 = 0;
    local_9f8 = 0;
    local_a28 = 0;
    uStack_a20 = 0;
    local_a18 = 0;
    pLVar8 = &local_260;
    pdVar9 = (double *)&stack0xfffffffffffff248;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pdVar9 = pLVar8->leafSAH;
      pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar12 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
    }
    statAABBNodes_02.numNodes = uStack_980;
    statAABBNodes_02.nodeSAH = (double)local_988;
    statAABBNodes_02.numChildren = local_978;
    statOBBNodes_02.numNodes = uStack_9a0;
    statOBBNodes_02.nodeSAH = (double)local_9a8;
    statOBBNodes_02.numChildren = local_998;
    statAABBNodesMB_02.numNodes = uStack_9c0;
    statAABBNodesMB_02.nodeSAH = (double)local_9c8;
    statAABBNodesMB_02.numChildren = local_9b8;
    statAABBNodesMB4D_02.numNodes = uStack_9e0;
    statAABBNodesMB4D_02.nodeSAH = (double)local_9e8;
    statAABBNodesMB4D_02.numChildren = local_9d8;
    statOBBNodesMB_02.numNodes = uStack_a00;
    statOBBNodesMB_02.nodeSAH = (double)local_a08;
    statOBBNodesMB_02.numChildren = local_9f8;
    statQuantizedNodes_02.numNodes = uStack_a20;
    statQuantizedNodes_02.nodeSAH = (double)local_a28;
    statQuantizedNodes_02.numChildren = local_a18;
    Statistics::Statistics
              (&local_448,0,in_stack_fffffffffffff248,statAABBNodes_02,statOBBNodes_02,
               statAABBNodesMB_02,statAABBNodesMB4D_02,statOBBNodesMB_02,statQuantizedNodes_02);
    local_c40.func = &local_c58;
    local_c58.this = (BVHNStatistics<4> *)local_ca8;
    local_c40.reduction = Statistics::add;
    local_c28.my_version = proxy_support;
    local_c28.my_traits = (context_traits)0x4;
    local_c28.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_c28.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_c28.my_name = CUSTOM_CTX;
    local_c58.n = (AABBNode **)(local_ca8 + 8);
    local_c40.identity = &local_448;
    tbb::detail::r1::initialize(&local_c28);
    local_c70.my_end = 4;
    local_c70.my_begin = 0;
    local_c70.my_grainsize = 1;
    local_568.my_real_body = &local_c80;
    local_c80.reduction = Statistics::add;
    local_568.my_reduction = Statistics::add;
    local_c80.func = &local_c40;
    local_568.my_identity_element = &local_448;
    memcpy(&local_568.my_value,&local_448,0x108);
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_reduce.h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run(&local_c70,&local_568,(auto_partitioner *)&local_670,&local_c28);
    memcpy(&local_670,&local_568.my_value,0x108);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_c28);
    if (cVar3 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_c28);
    operator+((Statistics *)&local_568,__return_storage_ptr__,&local_670);
    memcpy(__return_storage_ptr__,&local_568,0x108);
    psVar1 = &(__return_storage_ptr__->statAABBNodesMB4D).numNodes;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->statAABBNodesMB4D).nodeSAH =
         (double)local_c98._0_8_ * A + (__return_storage_ptr__->statAABBNodesMB4D).nodeSAH;
  }
  __return_storage_ptr__->depth = __return_storage_ptr__->depth + 1;
  return __return_storage_ptr__;
}

Assistant:

typename BVHNStatistics<N>::Statistics BVHNStatistics<N>::statistics(NodeRef node, const double A, const BBox1f t0t1)
  {
    Statistics s;
    assert(t0t1.size() > 0.0f);
    double dt = max(0.0f,t0t1.size());
    if (node.isAABBNode())
    {
      AABBNode* n = node.getAABBNode();
      s = s + parallel_reduce(0,N,Statistics(),[&] ( const int i ) {
          if (n->child(i) == BVH::emptyNode) return Statistics();
          const double Ai = max(0.0f,halfArea(n->extend(i)));
          Statistics s = statistics(n->child(i),Ai,t0t1); 
          s.statAABBNodes.numChildren++;
          return s;
        }, Statistics::add);
      s.statAABBNodes.numNodes++;
      s.statAABBNodes.nodeSAH += dt*A;
      s.depth++;
    }
    else if (node.isOBBNode())
    {
      OBBNode* n = node.ungetAABBNode();
      s = s + parallel_reduce(0,N,Statistics(),[&] ( const int i ) {
          if (n->child(i) == BVH::emptyNode) return Statistics();
          const double Ai = max(0.0f,halfArea(n->extent(i)));
          Statistics s = statistics(n->child(i),Ai,t0t1); 
          s.statOBBNodes.numChildren++;
          return s;
        }, Statistics::add);
      s.statOBBNodes.numNodes++;
      s.statOBBNodes.nodeSAH += dt*A;
      s.depth++;
    }
    else if (node.isAABBNodeMB())
    {
      AABBNodeMB* n = node.getAABBNodeMB();
      s = s + parallel_reduce(0,N,Statistics(),[&] ( const int i ) {
          if (n->child(i) == BVH::emptyNode) return Statistics();
          const double Ai = max(0.0f,n->expectedHalfArea(i,t0t1));
          Statistics s = statistics(n->child(i),Ai,t0t1);
          s.statAABBNodesMB.numChildren++;
          return s;
        }, Statistics::add);
      s.statAABBNodesMB.numNodes++;
      s.statAABBNodesMB.nodeSAH += dt*A;
      s.depth++;
    }
    else if (node.isAABBNodeMB4D())
    {
      AABBNodeMB4D* n = node.getAABBNodeMB4D();
      s = s + parallel_reduce(0,N,Statistics(),[&] ( const int i ) {
          if (n->child(i) == BVH::emptyNode) return Statistics();
          const BBox1f t0t1i = intersect(t0t1,n->timeRange(i));
          assert(!t0t1i.empty());
          const double Ai = n->AABBNodeMB::expectedHalfArea(i,t0t1i);
          Statistics s =  statistics(n->child(i),Ai,t0t1i);
          s.statAABBNodesMB4D.numChildren++;
          return s;
        }, Statistics::add);
      s.statAABBNodesMB4D.numNodes++;
      s.statAABBNodesMB4D.nodeSAH += dt*A;
      s.depth++;
    }
    else if (node.isOBBNodeMB())
    {
      OBBNodeMB* n = node.ungetAABBNodeMB();
      s = s + parallel_reduce(0,N,Statistics(),[&] ( const int i ) {
          if (n->child(i) == BVH::emptyNode) return Statistics();
          const double Ai = max(0.0f,halfArea(n->extent0(i)));
          Statistics s = statistics(n->child(i),Ai,t0t1); 
          s.statOBBNodesMB.numChildren++;
          return s;
        }, Statistics::add);
      s.statOBBNodesMB.numNodes++;
      s.statOBBNodesMB.nodeSAH += dt*A;
      s.depth++;
    }
    else if (node.isQuantizedNode())
    {
      QuantizedNode* n = node.quantizedNode();
      s = s + parallel_reduce(0,N,Statistics(),[&] ( const int i ) {
          if (n->child(i) == BVH::emptyNode) return Statistics();
          const double Ai = max(0.0f,halfArea(n->extent(i)));
          Statistics s = statistics(n->child(i),Ai,t0t1); 
          s.statQuantizedNodes.numChildren++;
          return s;
        }, Statistics::add);
      s.statQuantizedNodes.numNodes++;
      s.statQuantizedNodes.nodeSAH += dt*A;
      s.depth++;
    }
    else if (node.isLeaf())
    {
      size_t num; const char* tri = node.leaf(num);
      if (num)
      {
        for (size_t i=0; i<num; i++)
        {
          const size_t bytes = bvh->primTy->getBytes(tri);
          s.statLeaf.numPrimsActive += bvh->primTy->sizeActive(tri);
          s.statLeaf.numPrimsTotal += bvh->primTy->sizeTotal(tri);
          s.statLeaf.numBytes += bytes;
          tri+=bytes;
        }
        s.statLeaf.numLeaves++;
        s.statLeaf.numPrimBlocks += num;
        s.statLeaf.leafSAH += dt*A*num;
        if (num-1 < Statistics::LeafStat::NHIST) {
          s.statLeaf.numPrimBlocksHistogram[num-1]++;
        }
      }
    }
    else {
      throw std::runtime_error("not supported node type in bvh_statistics");
    }
    return s;
  }